

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

void __thiscall deqp::egl::anon_unknown_1::ShadersOOB::~ShadersOOB(ShadersOOB *this)

{
  (this->super_ContextReset)._vptr_ContextReset = (_func_int **)&PTR__ShadersOOB_003d8eb0;
  (*((this->super_ContextReset).m_gl)->getGraphicsResetStatus)();
  (*(this->super_ContextReset)._vptr_ContextReset[4])(this);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

ShadersOOB::~ShadersOOB (void)
{
	try
	{
		// Reset GL_CONTEXT_LOST error before destroying resources
		m_gl.getGraphicsResetStatus();
		teardown();
	}
	catch (...)
	{
		// Ignore GL errors from teardown()
	}
}